

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testBaseLimits(string *tempdir)

{
  ostream *poVar1;
  char *in_RCX;
  int mxh;
  int mxw;
  float dcq;
  
  exr_set_default_maximum_image_size(0x2a,0x2a);
  exr_get_default_maximum_image_size(&mxw,&mxh);
  if ((mxw != 0x2a) || (mxh != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_image_size: 42, 42 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x103,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0xffffffffffffffff,0xffffffff);
  exr_get_default_maximum_image_size(&mxw,&mxh);
  if ((mxw != 0x2a) || (mxh != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x10c,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0x54,0xffffffffffffffff);
  exr_get_default_maximum_image_size(&mxw,&mxh);
  if ((mxw != 0x2a) || (mxh != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x116,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0xffffffffffffffff,0x54);
  exr_get_default_maximum_image_size(&mxw,&mxh);
  if ((mxw != 0x2a) || (mxh != 0x2a)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x120,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0x80,0x80);
  exr_get_default_maximum_tile_size(&mxw,&mxh);
  if ((mxw != 0x80) || (mxh != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unable to set_default_maximum_tile_size: 128, 128 -> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x129,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0xffffffffffffffff,0xffffffff);
  exr_get_default_maximum_tile_size(&mxw,&mxh);
  if ((mxw != 0x80) || (mxh != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x132,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0x54,0xffffffffffffffff);
  exr_get_default_maximum_tile_size(&mxw,&mxh);
  if ((mxw != 0x80) || (mxh != 0x80)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
    std::endl<char,std::char_traits<char>>(poVar1);
    core_test_fail("false",(char *)0x13b,0x1552ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0xffffffffffffffff,0x54);
  exr_get_default_maximum_tile_size(&mxw,&mxh);
  if ((mxw == 0x80) && (mxh == 0x80)) {
    exr_set_default_maximum_image_size(0,0);
    exr_set_default_maximum_tile_size(0,0);
    exr_set_default_zip_compression_level(4);
    exr_get_default_zip_compression_level(&mxw);
    if (mxw != 4) {
      core_test_fail("mxw == 4",(char *)0x14b,0x1552ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xffffffffffffffff);
    exr_get_default_zip_compression_level(&mxw);
    if (mxw != -1) {
      core_test_fail("mxw == -1",(char *)0x14f,0x1552ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xfffffffffffffffe);
    exr_get_default_zip_compression_level(&mxw);
    if (mxw != -1) {
      core_test_fail("mxw == -1",(char *)0x152,0x1552ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xf);
    exr_get_default_zip_compression_level(&mxw);
    if (mxw == 9) {
      exr_set_default_zip_compression_level(0xffffffffffffffff);
      exr_set_default_dwa_compression_quality(0x41b80000);
      exr_get_default_dwa_compression_quality(&dcq);
      if ((dcq != 23.0) || (NAN(dcq))) {
        core_test_fail("dcq == 23.f",(char *)0x15c,0x1552ad,in_RCX);
      }
      exr_set_default_dwa_compression_quality(0xbf800000);
      exr_get_default_dwa_compression_quality(&dcq);
      if ((dcq == 0.0) && (!NAN(dcq))) {
        exr_set_default_dwa_compression_quality(0x43480000);
        exr_get_default_dwa_compression_quality(&dcq);
        if ((dcq == 100.0) && (!NAN(dcq))) {
          exr_set_default_dwa_compression_quality(0x42340000);
          return;
        }
        core_test_fail("dcq == 100.f",(char *)0x164,0x1552ad,in_RCX);
      }
      core_test_fail("dcq == 0.f",(char *)0x160,0x1552ad,in_RCX);
    }
    core_test_fail("mxw == 9",(char *)0x156,0x1552ad,in_RCX);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxw);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mxh);
  std::endl<char,std::char_traits<char>>(poVar1);
  core_test_fail("false",(char *)0x144,0x1552ad,in_RCX);
}

Assistant:

void
testBaseLimits (const std::string& tempdir)
{
    int mxw, mxh;
    exr_set_default_maximum_image_size (42, 42);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr << "Unable to set_default_maximum_image_size: 42, 42 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (-1, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (84, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (-1, 84);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_tile_size (128, 128);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr << "Unable to set_default_maximum_tile_size: 128, 128 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (84, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, 84);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (0, 0);
    exr_set_default_maximum_tile_size (0, 0);

    exr_set_default_zip_compression_level (4);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == 4);

    exr_set_default_zip_compression_level (-1);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == -1);
    exr_set_default_zip_compression_level (-2);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == -1);

    exr_set_default_zip_compression_level (15);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == 9);
    exr_set_default_zip_compression_level (-1);

    float dcq;
    exr_set_default_dwa_compression_quality (23.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 23.f);

    exr_set_default_dwa_compression_quality (-1.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 0.f);

    exr_set_default_dwa_compression_quality (200.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 100.f);
    exr_set_default_dwa_compression_quality (45.f);
}